

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void __thiscall
QInternalMessageLogContext::populateBacktrace(QInternalMessageLogContext *this,int frameCount)

{
  uint uVar1;
  enable_if_t<is_constructible_v<QVarLengthArray<void_*,_32LL>,_int>,_QVarLengthArray<void_*,_32LL>_&>
  this_00;
  long in_FS_OFFSET;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = frameCount + 3;
  this_00 = std::optional<QVarLengthArray<void_*,_32LL>_>::emplace<int>(&this->backtrace,&local_14);
  uVar1 = backtrace((this_00->super_QVLABase<void_*>).super_QVLABaseBase.ptr,
                    (int)(this_00->super_QVLABase<void_*>).super_QVLABaseBase.s);
  if ((int)uVar1 < 1) {
    (this_00->super_QVLABase<void_*>).super_QVLABaseBase.s = 0;
  }
  else {
    QVarLengthArray<void_*,_32LL>::resize(this_00,(ulong)uVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void QInternalMessageLogContext::populateBacktrace(int frameCount)
{
    assert(frameCount >= 0);
    BacktraceStorage &result = backtrace.emplace(TypicalBacktraceFrameCount + frameCount);
    int n = ::backtrace(result.data(), result.size());
    if (n <= 0)
        result.clear();
    else
        result.resize(n);
}